

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O2

AST * parse_equality_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST_Type type;
  AST_Binary_Expression *left;
  AST *right;
  
  left = (AST_Binary_Expression *)parse_relational_expression(translation_data,scope);
  while ((translation_data->tokens->size != 0 &&
         ((iVar1 = *translation_data->tokens->first->data, type = OP_EQUAL, iVar1 == 0x31 ||
          (type = OP_NOT_EQUAL, iVar1 == 0x43))))) {
    chomp(translation_data);
    right = parse_relational_expression(translation_data,scope);
    left = get_binary_expression_tree((AST *)left,right,type);
  }
  return (AST *)left;
}

Assistant:

struct AST* parse_equality_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct AST *hold;
	hold=parse_relational_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_EQEQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_relational_expression(translation_data,scope),OP_EQUAL);
				break;
			case KW_NOT_EQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_relational_expression(translation_data,scope),OP_NOT_EQUAL);
				break;
			default:
				return hold;
		}
	}
	return hold;
}